

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_primary_expression(xpath_parser *this)

{
  bool bVar1;
  lexeme_t lVar2;
  xpath_value_type rettype;
  char_t *pcVar3;
  xpath_lexer_string *pxVar4;
  xpath_ast_node *pxVar5;
  xpath_ast_node *n_1;
  xpath_ast_node *last_arg;
  xpath_lexer_string function;
  size_t argc;
  xpath_ast_node *args [2];
  double value_1;
  char_t *value;
  xpath_ast_node *n;
  xpath_variable *var;
  xpath_lexer_string name;
  xpath_parser *this_local;
  
  name.end = (char_t *)this;
  lVar2 = xpath_lexer::current(&this->_lexer);
  switch(lVar2) {
  case lex_var_ref:
    pxVar4 = xpath_lexer::contents(&this->_lexer);
    var = (xpath_variable *)pxVar4->begin;
    name.begin = pxVar4->end;
    if (this->_variables == (xpath_variable_set *)0x0) {
      this_local = (xpath_parser *)error(this,"Unknown variable: variable set is not provided");
    }
    else {
      n = (xpath_ast_node *)0x0;
      bVar1 = get_variable_scratch
                        (&this->_scratch,this->_variables,(char_t *)var,name.begin,
                         (xpath_variable **)&n);
      if (bVar1) {
        if (n == (xpath_ast_node *)0x0) {
          this_local = (xpath_parser *)
                       error(this,"Unknown variable: variable set does not contain the given name");
        }
        else {
          xpath_lexer::next(&this->_lexer);
          rettype = xpath_variable::type((xpath_variable *)n);
          this_local = (xpath_parser *)alloc_node(this,ast_variable,rettype,(xpath_variable *)n);
        }
      }
      else {
        this_local = (xpath_parser *)error_oom(this);
      }
    }
    break;
  case lex_open_brace:
    xpath_lexer::next(&this->_lexer);
    this_local = (xpath_parser *)parse_expression(this,0);
    if (this_local == (xpath_parser *)0x0) {
      this_local = (xpath_parser *)0x0;
    }
    else {
      lVar2 = xpath_lexer::current(&this->_lexer);
      if (lVar2 == lex_close_brace) {
        xpath_lexer::next(&this->_lexer);
      }
      else {
        this_local = (xpath_parser *)error(this,"Expected \')\' to match an opening \'(\'");
      }
    }
    break;
  default:
    this_local = (xpath_parser *)error(this,"Unrecognizable primary expression");
    break;
  case lex_quoted_string:
    pxVar4 = xpath_lexer::contents(&this->_lexer);
    pcVar3 = alloc_string(this,pxVar4);
    if (pcVar3 == (char_t *)0x0) {
      this_local = (xpath_parser *)0x0;
    }
    else {
      xpath_lexer::next(&this->_lexer);
      this_local = (xpath_parser *)alloc_node(this,ast_string_constant,xpath_type_string,pcVar3);
    }
    break;
  case lex_number:
    args[1] = (xpath_ast_node *)0x0;
    pxVar4 = xpath_lexer::contents(&this->_lexer);
    pcVar3 = pxVar4->begin;
    pxVar4 = xpath_lexer::contents(&this->_lexer);
    bVar1 = convert_string_to_number_scratch
                      (&this->_scratch,pcVar3,pxVar4->end,(double *)(args + 1));
    if (bVar1) {
      xpath_lexer::next(&this->_lexer);
      this_local = (xpath_parser *)
                   alloc_node(this,ast_number_constant,xpath_type_number,(double)args[1]);
    }
    else {
      this_local = (xpath_parser *)error_oom(this);
    }
    break;
  case lex_string:
    memset(&argc,0,0x10);
    function.end = (char_t *)0x0;
    pxVar4 = xpath_lexer::contents(&this->_lexer);
    last_arg = (xpath_ast_node *)pxVar4->begin;
    function.begin = pxVar4->end;
    xpath_lexer::next(&this->_lexer);
    n_1 = (xpath_ast_node *)0x0;
    lVar2 = xpath_lexer::current(&this->_lexer);
    if (lVar2 == lex_open_brace) {
      xpath_lexer::next(&this->_lexer);
      while (lVar2 = xpath_lexer::current(&this->_lexer), lVar2 != lex_close_brace) {
        if (function.end != (char_t *)0x0) {
          lVar2 = xpath_lexer::current(&this->_lexer);
          if (lVar2 != lex_comma) {
            pxVar5 = error(this,"No comma between function arguments");
            return pxVar5;
          }
          xpath_lexer::next(&this->_lexer);
        }
        pxVar5 = parse_expression(this,0);
        if (pxVar5 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        if (function.end < (char_t *)0x2) {
          args[(long)(function.end + -1)] = pxVar5;
        }
        else {
          xpath_ast_node::set_next(n_1,pxVar5);
        }
        function.end = function.end + 1;
        n_1 = pxVar5;
      }
      xpath_lexer::next(&this->_lexer);
      this_local = (xpath_parser *)
                   parse_function(this,(xpath_lexer_string *)&last_arg,(size_t)function.end,
                                  (xpath_ast_node **)&argc);
    }
    else {
      this_local = (xpath_parser *)error(this,"Unrecognized function call");
    }
  }
  return (xpath_ast_node *)this_local;
}

Assistant:

xpath_ast_node* parse_primary_expression()
		{
			switch (_lexer.current())
			{
			case lex_var_ref:
			{
				xpath_lexer_string name = _lexer.contents();

				if (!_variables)
					return error("Unknown variable: variable set is not provided");

				xpath_variable* var = 0;
				if (!get_variable_scratch(_scratch, _variables, name.begin, name.end, &var))
					return error_oom();

				if (!var)
					return error("Unknown variable: variable set does not contain the given name");

				_lexer.next();

				return alloc_node(ast_variable, var->type(), var);
			}

			case lex_open_brace:
			{
				_lexer.next();

				xpath_ast_node* n = parse_expression();
				if (!n) return 0;

				if (_lexer.current() != lex_close_brace)
					return error("Expected ')' to match an opening '('");

				_lexer.next();

				return n;
			}

			case lex_quoted_string:
			{
				const char_t* value = alloc_string(_lexer.contents());
				if (!value) return 0;

				_lexer.next();

				return alloc_node(ast_string_constant, xpath_type_string, value);
			}

			case lex_number:
			{
				double value = 0;

				if (!convert_string_to_number_scratch(_scratch, _lexer.contents().begin, _lexer.contents().end, &value))
					return error_oom();

				_lexer.next();

				return alloc_node(ast_number_constant, xpath_type_number, value);
			}

			case lex_string:
			{
				xpath_ast_node* args[2] = {0};
				size_t argc = 0;

				xpath_lexer_string function = _lexer.contents();
				_lexer.next();

				xpath_ast_node* last_arg = 0;

				if (_lexer.current() != lex_open_brace)
					return error("Unrecognized function call");
				_lexer.next();

				while (_lexer.current() != lex_close_brace)
				{
					if (argc > 0)
					{
						if (_lexer.current() != lex_comma)
							return error("No comma between function arguments");
						_lexer.next();
					}

					xpath_ast_node* n = parse_expression();
					if (!n) return 0;

					if (argc < 2) args[argc] = n;
					else last_arg->set_next(n);

					argc++;
					last_arg = n;
				}

				_lexer.next();

				return parse_function(function, argc, args);
			}

			default:
				return error("Unrecognizable primary expression");
			}
		}